

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O0

Value * __thiscall camp::TagHolder::tag(TagHolder *this,Value *id)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  Value *id_local;
  TagHolder *this_local;
  
  it._M_node = (_Base_ptr)id;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
       ::find(&this->m_tags,id);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<camp::Value,_camp::detail::Getter<camp::Value>,_std::less<camp::Value>,_std::allocator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>_>
       ::end(&this->m_tags);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_camp::Value,_camp::detail::Getter<camp::Value>_>_>
             ::operator->(&local_28);
    this_local = (TagHolder *)detail::Getter<camp::Value>::get(&ppVar2->second);
  }
  else {
    this_local = (TagHolder *)Value::nothing;
  }
  return (Value *)this_local;
}

Assistant:

const Value& TagHolder::tag(const Value& id) const
{
    TagsTable::const_iterator it = m_tags.find(id);
    if (it != m_tags.end())
        return it->second.get();

    return Value::nothing;
}